

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskBuilder.cpp
# Opt level: O2

int __thiscall
DiskBuilder::LoadDisk
          (DiskBuilder *this,char *file_path,IDisk **created_disk,ILoadingProgress *loading_progress
          )

{
  int iVar1;
  pointer ppFVar2;
  
  ppFVar2 = (this->format_list_).super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (ppFVar2 ==
        (this->format_list_).super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      return -1;
    }
    iVar1 = (*(*ppFVar2)->_vptr_FormatType[5])(*ppFVar2,file_path);
    if ((char)iVar1 != '\0') break;
    ppFVar2 = ppFVar2 + 1;
  }
  iVar1 = (*(*ppFVar2)->_vptr_FormatType[6])(*ppFVar2,file_path,created_disk,loading_progress);
  return iVar1;
}

Assistant:

int DiskBuilder::LoadDisk(const char* file_path, IDisk*& created_disk, ILoadingProgress* loading_progress)
{
   // Select correct builder
   for (auto it = format_list_.begin(); it != format_list_.end(); it++)
   {
      if ((*it)->CanLoad(file_path))
      {
         return (*it)->LoadDisk(file_path, created_disk, loading_progress);
      }
   }

   // Nobody can load this file
   return -1;
}